

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmh.h
# Opt level: O1

carray<frozen::bits::pmh_buckets<8UL>::bucket_ref,_8UL> * __thiscall
frozen::bits::pmh_buckets<8UL>::get_sorted_buckets
          (carray<frozen::bits::pmh_buckets<8UL>::bucket_ref,_8UL> *__return_storage_ptr__,
          pmh_buckets<8UL> *this)

{
  bucket_size_compare local_9;
  
  __return_storage_ptr__->data_[0].hash = 0;
  __return_storage_ptr__->data_[0].ptr = (bucket_t *)this;
  __return_storage_ptr__->data_[1].hash = 1;
  __return_storage_ptr__->data_[1].ptr = (this->buckets).data_ + 1;
  __return_storage_ptr__->data_[2].hash = 2;
  __return_storage_ptr__->data_[2].ptr = (this->buckets).data_ + 2;
  __return_storage_ptr__->data_[3].hash = 3;
  __return_storage_ptr__->data_[3].ptr = (this->buckets).data_ + 3;
  __return_storage_ptr__->data_[4].hash = 4;
  __return_storage_ptr__->data_[4].ptr = (this->buckets).data_ + 4;
  __return_storage_ptr__->data_[5].hash = 5;
  __return_storage_ptr__->data_[5].ptr = (this->buckets).data_ + 5;
  __return_storage_ptr__->data_[6].hash = 6;
  __return_storage_ptr__->data_[6].ptr = (this->buckets).data_ + 6;
  __return_storage_ptr__->data_[7].hash = 7;
  __return_storage_ptr__->data_[7].ptr = (this->buckets).data_ + 7;
  quicksort<frozen::bits::pmh_buckets<8ul>::bucket_ref*,frozen::bits::bucket_size_compare>
            (__return_storage_ptr__->data_,__return_storage_ptr__->data_ + 7,&local_9);
  return __return_storage_ptr__;
}

Assistant:

carray<bucket_ref, M> constexpr get_sorted_buckets() const {
    carray<bucket_ref, M> result{this->make_bucket_refs(std::make_index_sequence<M>())};
    bits::quicksort(result.begin(), result.end() - 1, bucket_size_compare{});
    return result;
  }